

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::InitEdge2(TEdge *e,PolyType Pt)

{
  TEdge *pTVar1;
  PolyType Pt_local;
  TEdge *e_local;
  
  if ((e->Curr).Y < (e->Next->Curr).Y) {
    (e->Top).X = (e->Curr).X;
    (e->Top).Y = (e->Curr).Y;
    pTVar1 = e->Next;
    (e->Bot).X = (pTVar1->Curr).X;
    (e->Bot).Y = (pTVar1->Curr).Y;
  }
  else {
    (e->Bot).X = (e->Curr).X;
    (e->Bot).Y = (e->Curr).Y;
    pTVar1 = e->Next;
    (e->Top).X = (pTVar1->Curr).X;
    (e->Top).Y = (pTVar1->Curr).Y;
  }
  SetDx(e);
  e->PolyTyp = Pt;
  return;
}

Assistant:

void InitEdge2(TEdge& e, PolyType Pt)
{
  if (e.Curr.Y >= e.Next->Curr.Y)
  {
    e.Bot = e.Curr;
    e.Top = e.Next->Curr;
  } else
  {
    e.Top = e.Curr;
    e.Bot = e.Next->Curr;
  }
  SetDx(e);
  e.PolyTyp = Pt;
}